

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O1

LY_ERR lyjson_next_object_name(lyjson_ctx *jsonctx)

{
  char cVar1;
  ly_in *in;
  LY_ERR LVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  ly_ctx *ctx;
  
  in = jsonctx->in;
  cVar1 = *in->current;
  if (cVar1 == '}') {
    ly_in_skip(in,1);
    LVar2 = ly_set_add(&jsonctx->status,(void *)0x3,'\x01',(uint32_t *)0x0);
joined_r0x0011e2d8:
    if (LVar2 == LY_SUCCESS) {
      return LY_SUCCESS;
    }
    return LVar2;
  }
  if (cVar1 == '\"') {
    ly_in_skip(in,1);
    LVar2 = lyjson_string(jsonctx);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    lyjson_skip_ws(jsonctx);
    pcVar5 = jsonctx->in->current;
    if (*pcVar5 == ':') {
      ly_in_skip(jsonctx->in,1);
      LVar2 = ly_set_add(&jsonctx->status,(void *)0x7,'\x01',(uint32_t *)0x0);
      goto joined_r0x0011e2d8;
    }
    ctx = jsonctx->ctx;
    uVar3 = LY_VCODE_INSTREXP_len(pcVar5);
    pcVar5 = jsonctx->in->current;
    pcVar4 = "a JSON value name-separator \':\'";
  }
  else {
    if (cVar1 == '\0') {
      ly_vlog(jsonctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
      return LY_EVALID;
    }
    ctx = jsonctx->ctx;
    uVar3 = LY_VCODE_INSTREXP_len(in->current);
    pcVar5 = jsonctx->in->current;
    pcVar4 = "a JSON object name";
  }
  ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
          (ulong)uVar3,pcVar5,pcVar4);
  return LY_EVALID;
}

Assistant:

static LY_ERR
lyjson_next_object_name(struct lyjson_ctx *jsonctx)
{
    switch (*jsonctx->in->current) {
    case '\0':
        /* EOF */
        LOGVAL(jsonctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;

    case '"':
        /* object name */
        ly_in_skip(jsonctx->in, 1);
        LY_CHECK_RET(lyjson_string(jsonctx));
        lyjson_skip_ws(jsonctx);

        if (*jsonctx->in->current != ':') {
            LOGVAL(jsonctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(jsonctx->in->current), jsonctx->in->current,
                    "a JSON value name-separator ':'");
            return LY_EVALID;
        }
        ly_in_skip(jsonctx->in, 1);
        LYJSON_STATUS_PUSH_RET(jsonctx, LYJSON_OBJECT_NAME);
        break;

    case '}':
        /* object end */
        ly_in_skip(jsonctx->in, 1);
        LYJSON_STATUS_PUSH_RET(jsonctx, LYJSON_OBJECT_CLOSED);
        break;

    default:
        /* unexpected value */
        LOGVAL(jsonctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(jsonctx->in->current),
                jsonctx->in->current, "a JSON object name");
        return LY_EVALID;
    }

    return LY_SUCCESS;
}